

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

void mpi_sub_hlp(mbedtls_mpi *X,mbedtls_mpi *A,mbedtls_mpi *B)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = B->n;
  if (A->n < B->n) {
    uVar1 = A->n;
  }
  uVar2 = 0;
  for (uVar3 = 0; uVar1 != uVar3; uVar3 = uVar3 + 1) {
    uVar4 = A->p[uVar3] - uVar2;
    uVar2 = (ulong)(uVar4 < B->p[uVar3]) + (ulong)(A->p[uVar3] < uVar2);
    X->p[uVar3] = uVar4 - B->p[uVar3];
  }
  for (; (uVar3 = A->n, uVar1 < uVar3 && (uVar2 != 0)); uVar2 = (ulong)(uVar3 < uVar2)) {
    uVar3 = A->p[uVar1];
    X->p[uVar1] = uVar3 - uVar2;
    uVar1 = uVar1 + 1;
  }
  for (; uVar1 < uVar3; uVar1 = uVar1 + 1) {
    X->p[uVar1] = A->p[uVar1];
    uVar3 = A->n;
  }
  for (; uVar1 < X->n; uVar1 = uVar1 + 1) {
    X->p[uVar1] = 0;
  }
  return;
}

Assistant:

static void mpi_sub_hlp( mbedtls_mpi *X, const mbedtls_mpi *A, const mbedtls_mpi *B )
{
    size_t i;
    mbedtls_mpi_uint c = 0;
    size_t width = A->n > B->n ? B->n : A->n;

    for( i = 0; i < width; i++ )
    {
        mbedtls_mpi_uint a = A->p[i];
        mbedtls_mpi_uint b = B->p[i];
        mbedtls_mpi_uint z = a < c;

        X->p[i] = a - c;
        c = ( X->p[i] <  b ) + z;
        X->p[i] -= b;
    }

    for( ; i < A->n && c > 0; i++ )
    {
        mbedtls_mpi_uint a = A->p[i];
        mbedtls_mpi_uint z = a < c;
        X->p[i] = a - c;
        c = z;
    }

    for( ; i < A->n; i++ )
    {
        X->p[i] = A->p[i];
    }

    for( ; i < X->n; i++ )
    {
        X->p[i] = 0;
    }
}